

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O2

void __thiscall TPZIntTetra3D::SetOrder(TPZIntTetra3D *this,TPZVec<int> *ord,int type)

{
  int *piVar1;
  TPZIntRuleT3D *pTVar2;
  int iVar3;
  int order;
  
  piVar1 = ord->fStore;
  iVar3 = *piVar1;
  if (*piVar1 < piVar1[1]) {
    iVar3 = piVar1[1];
  }
  this->fOrdKsi = iVar3;
  if (iVar3 <= piVar1[2]) {
    iVar3 = piVar1[2];
  }
  order = 0xe;
  if (iVar3 < 0xe) {
    order = iVar3;
  }
  this->fOrdKsi = order;
  pTVar2 = TPZIntRuleList::GetRuleT3D(&TPZIntRuleList::gIntRuleList,order);
  this->fIntKsi = pTVar2;
  this->fOrdKsi = pTVar2->fOrder;
  return;
}

Assistant:

void TPZIntTetra3D::SetOrder(TPZVec<int> &ord,int type) {
	fOrdKsi = (ord[1] > ord[0]) ? ord[1] : ord[0];
	fOrdKsi = (fOrdKsi > ord[2]) ? fOrdKsi : ord[2];
	if(fOrdKsi > TPZIntRuleT3D::NRULESTETRAHEDRA_ORDER) {
#ifdef PZDEBUG
#ifdef PZ_LOG
            if(logger.isWarnEnabled())
            {
                std::stringstream sout;
                sout << "Integration rule for tetrahedra - Order is bigger than NRULESTETRAHEDRA_ORDER (Max)";
                sout << " fOrdKsi " << fOrdKsi << " TPZIntRuleT3D::NRULESTETRAHEDRA_ORDER " << TPZIntRuleT3D::NRULESTETRAHEDRA_ORDER;
                LOGPZ_WARN(logger, sout.str())
            }
#endif
#endif
		fOrdKsi = TPZIntRuleT3D::NRULESTETRAHEDRA_ORDER;
	}
	fIntKsi = TPZIntRuleList::gIntRuleList.GetRuleT3D(fOrdKsi);
    fOrdKsi = fIntKsi->Order();
}